

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O1

void pltcalc::
     loadoccurrence<occurrence,period_occ,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>>
               (occurrence *occ,period_occ *p,
               map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
               *m_occ,FILE *fin)

{
  iterator __position;
  size_t sVar1;
  vector<period_occ,std::allocator<period_occ>> *this;
  
  fread(&no_of_periods_,4,1,(FILE *)fin);
  while( true ) {
    sVar1 = fread(occ,0xc,1,(FILE *)fin);
    if (sVar1 == 0) break;
    p->occ_date_id = occ->occ_date_id;
    p->period_no = occ->period_no;
    this = (vector<period_occ,std::allocator<period_occ>> *)
           std::
           map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
           ::operator[](m_occ,&occ->event_id);
    __position._M_current = *(period_occ **)(this + 8);
    if (__position._M_current == *(period_occ **)(this + 0x10)) {
      std::vector<period_occ,std::allocator<period_occ>>::_M_realloc_insert<period_occ_const&>
                (this,__position,p);
    }
    else {
      *__position._M_current = *p;
      *(long *)(this + 8) = *(long *)(this + 8) + 8;
    }
  }
  return;
}

Assistant:

void loadoccurrence(occT &occ, periodT &p, moccT &m_occ, FILE * fin)
	{
		size_t i = fread(&no_of_periods_, sizeof(no_of_periods_), 1,
				 fin);
		i = fread(&occ, sizeof(occ), 1, fin);
		while (i != 0) {
			p.occ_date_id = occ.occ_date_id;
			p.period_no = occ.period_no;
			m_occ[occ.event_id].push_back(p);
			i = fread(&occ, sizeof(occ), 1, fin);
		}
	}